

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool duckdb::FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,duckdb::hugeint_t>
               (char *input_str,hugeint_t *result)

{
  string_t input_00;
  bool bVar1;
  string_t input;
  undefined8 in_stack_00000038;
  char *in_stack_ffffffffffffffd8;
  string_t *in_stack_ffffffffffffffe0;
  
  string_t::string_t(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  input_00.value.pointer.ptr = (char *)in_stack_00000038;
  input_00.value._0_8_ = input_str;
  bVar1 = TryCast::Operation<duckdb::string_t,duckdb::hugeint_t>
                    (input_00,result,(bool)input.value.inlined.inlined[0xb]);
  return bVar1;
}

Assistant:

static bool Operation(SOURCE_TYPE input_str, RESULT_TYPE &result) {
		string_t input(input_str);
		return OP::template Operation<string_t, RESULT_TYPE>(input, result);
	}